

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O2

void __thiscall vera::HaveDefines::addDefine(HaveDefines *this,string *_define,vec2 _v)

{
  int in_R8D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  vec2 _v_local;
  string local_38;
  
  _v_local = _v;
  toString_abi_cxx11_(&local_38,(vera *)&_v_local,(vec2 *)0x2c,'\x03',in_R8D);
  std::operator+(&local_80,"vec2(",&local_38);
  std::operator+(&local_60,&local_80,")");
  (*this->_vptr_HaveDefines[10])(this,_define,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void HaveDefines::addDefine( const std::string &_define, glm::vec2 _v ) {
    addDefine(_define, "vec2(" + toString(_v, ',') + ")");
}